

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

string * __thiscall adios2::Engine::Name_abi_cxx11_(Engine *this)

{
  long *in_RSI;
  string *in_RDI;
  string *in_stack_00000048;
  Engine *in_stack_00000050;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"in call to Engine::Name",&local_31);
  helper::CheckForNullptr<adios2::core::Engine>(in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string(in_RDI,(string *)(*in_RSI + 0x30));
  return in_RDI;
}

Assistant:

std::string Engine::Name() const
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::Name");
    return m_Engine->m_Name;
}